

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

bool unplugGroup(QMainWindowLayout *layout,QLayoutItem **item,QDockAreaLayoutItem *parentItem)

{
  QDockAreaLayoutInfo *pQVar1;
  Data *pDVar2;
  undefined8 uVar3;
  QMainWindow *pQVar4;
  QTabBar *pQVar5;
  Representation RVar6;
  Representation RVar7;
  undefined7 uVar8;
  bool bVar9;
  QDockWidgetGroupWindow *this;
  QLayout *pQVar10;
  QWidget *this_00;
  QPoint QVar11;
  QLayoutItem *pQVar12;
  int __sig;
  long in_FS_OFFSET;
  QRect local_48;
  long local_38;
  
  __sig = (int)&local_48;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((parentItem->subinfo == (QDockAreaLayoutInfo *)0x0) || (parentItem->subinfo->tabbed != true))
  {
    bVar9 = false;
  }
  else {
    this = QMainWindowLayout::createTabbedDockWindow((QMainWindowLayout *)layout);
    pQVar10 = QWidget::layout(&this->super_QWidget);
    pQVar1 = parentItem->subinfo;
    pQVar10[4].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)pQVar1->sep;
    QArrayDataPointer<QWidget_*>::operator=
              ((QArrayDataPointer<QWidget_*> *)&pQVar10[4].super_QLayoutItem.align,
               &(pQVar1->separatorWidgets).d);
    RVar6.m_i = (pQVar1->rect).x1.m_i;
    RVar7.m_i = (pQVar1->rect).y1.m_i;
    uVar3 = *(undefined8 *)&(pQVar1->rect).x2;
    pQVar4 = pQVar1->mainWindow;
    pQVar10[5].super_QLayoutItem._vptr_QLayoutItem = *(_func_int ***)&pQVar1->dockPos;
    pQVar10[5].super_QLayoutItem.align = (Alignment)RVar6.m_i;
    *(int *)&pQVar10[5].super_QLayoutItem.field_0xc = RVar7.m_i;
    *(undefined8 *)(pQVar10 + 6) = uVar3;
    *(QMainWindow **)&pQVar10[6].field_0x8 = pQVar4;
    QArrayDataPointer<QDockAreaLayoutItem>::operator=
              ((QArrayDataPointer<QDockAreaLayoutItem> *)&pQVar10[6].super_QLayoutItem,
               &(pQVar1->item_list).d);
    pQVar10[7].super_QLayoutItem.align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i = pQVar1->tabBarShape;
    uVar8 = *(undefined7 *)&pQVar1->field_0x59;
    pQVar5 = pQVar1->tabBar;
    pQVar10[7].field_0x8 = pQVar1->tabbed;
    *(undefined7 *)&pQVar10[7].field_0x9 = uVar8;
    pQVar10[7].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)pQVar5;
    pQVar1 = parentItem->subinfo;
    if (pQVar1 != (QDockAreaLayoutInfo *)0x0) {
      QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(&(pQVar1->item_list).d);
      pDVar2 = (pQVar1->separatorWidgets).d.d;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&((pQVar1->separatorWidgets).d.d)->super_QArrayData,8,0x10);
        }
      }
    }
    operator_delete(pQVar1,0x70);
    parentItem->subinfo = (QDockAreaLayoutInfo *)0x0;
    this_00 = QLayout::parentWidget(&layout->super_QLayout);
    QVar11 = QWidget::pos(this_00);
    local_48.x1.m_i =
         pQVar10[5].super_QLayoutItem.align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
         super_QFlagsStorage<Qt::AlignmentFlag>.i + QVar11.xp.m_i.m_i;
    local_48.x2.m_i = *(int *)(pQVar10 + 6) + QVar11.xp.m_i.m_i;
    local_48.y1.m_i = *(int *)&pQVar10[5].super_QLayoutItem.field_0xc + QVar11.yp.m_i.m_i;
    local_48.y2.m_i = QVar11.yp.m_i.m_i + *(int *)&pQVar10[6].field_0x4;
    QWidget::setGeometry(&this->super_QWidget,&local_48);
    QWidget::show(&this->super_QWidget);
    QWidget::raise(&this->super_QWidget,__sig);
    pQVar12 = (QLayoutItem *)operator_new(0x18);
    (pQVar12->align).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i = 0;
    pQVar12[1]._vptr_QLayoutItem = (_func_int **)this;
    pQVar12->_vptr_QLayoutItem = (_func_int **)&PTR__QWidgetItem_007f1fe8;
    *item = pQVar12;
    parentItem->widgetItem = pQVar12;
    bVar9 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar9;
  }
  __stack_chk_fail();
}

Assistant:

static bool unplugGroup(QMainWindowLayout *layout, QLayoutItem **item,
                        QDockAreaLayoutItem &parentItem)
{
    if (!parentItem.subinfo || !parentItem.subinfo->tabbed)
        return false;

    // The QDockWidget is part of a group of tab and we need to unplug them all.
    QDockWidgetGroupWindow *floatingTabs = layout->createTabbedDockWindow();
    QDockAreaLayoutInfo *info = floatingTabs->layoutInfo();
    *info = std::move(*parentItem.subinfo);
    delete parentItem.subinfo;
    parentItem.subinfo = nullptr;
    floatingTabs->setGeometry(info->rect.translated(layout->parentWidget()->pos()));
    floatingTabs->show();
    floatingTabs->raise();
    *item = new QDockWidgetGroupWindowItem(floatingTabs);
    parentItem.widgetItem = *item;
    return true;
}